

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::advance_chemistry(PeleLM *this,MultiFab *mf_old,MultiFab *mf_new,Real dt,MultiFab *Force)

{
  Geometry *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
  *this_01;
  IntVect *pIVar1;
  Amr *pAVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar5;
  pointer pIVar6;
  pointer pBVar7;
  pointer pBVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  ulong uVar10;
  int iVar11;
  long lVar12;
  Periodicity *pPVar13;
  mapped_type *pmVar14;
  double *pdVar15;
  ostream *poVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  pointer pcVar25;
  undefined4 uVar26;
  int iVar27;
  undefined8 unaff_RBP;
  long lVar28;
  int iVar29;
  undefined8 *puVar30;
  BoxArray *pBVar31;
  element_type *peVar32;
  double *pdVar33;
  double *pdVar34;
  double *pdVar35;
  long lVar36;
  _Head_base<0UL,_amrex::MultiFab_*,_false> this_03;
  FabArray<amrex::FArrayBox> *pFVar37;
  bool bVar38;
  bool bVar39;
  byte bVar40;
  double dVar41;
  Periodicity PVar42;
  double *local_d38;
  long local_d28;
  pointer local_d10;
  long local_d08;
  long local_d00;
  undefined1 local_cb8 [32];
  int local_c98;
  int local_c94;
  int local_c90;
  DistributionMapping local_c78;
  FabArray<amrex::FArrayBox> *local_c60;
  Real local_c58;
  long local_c50;
  long local_c48;
  double local_c40;
  long local_c38;
  long local_c30;
  undefined **local_c28;
  long local_c20;
  ulong local_c18;
  long local_c10;
  undefined4 local_c04;
  undefined4 local_c00;
  Box local_bfc;
  FabArray<amrex::FArrayBox> *local_be0;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_bd8;
  Real time_chem;
  Real dt_incr;
  Array4<double> local_bc0;
  double local_b80;
  long local_b78;
  _Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_b70;
  double *local_b68;
  long local_b60;
  long local_b58;
  pointer local_b50;
  Array4<double> local_b48;
  MFIter Smfi;
  Array4<double> local_980;
  Array4<double> local_940;
  Array4<double> local_900;
  BoxArray ba;
  BoxArray cf_grids;
  Array4<int> local_7f0;
  MultiFab fcnCntTemp;
  MultiFab STemp;
  MultiFab diagTemp;
  MultiFab FTemp;
  FabArray<amrex::BaseFab<int>_> react_mask;
  
  bVar40 = 0;
  local_c60 = &Force->super_FabArray<amrex::FArrayBox>;
  local_c58 = dt;
  local_b80 = amrex::ParallelDescriptor::second();
  if (avg_down_chem == true) {
    iVar27 = (this->super_NavierStokesBase).super_AmrLevel.level;
    pAVar2 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    if (*(int *)&(pAVar2->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c <= iVar27)
    goto LAB_00279f3d;
    uVar26 = (undefined4)
             CONCAT71((int7)((ulong)unaff_RBP >> 8),
                      *(long *)(*(long *)((long)(pAVar2->amr_level).
                                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                .
                                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [(long)iVar27 + 1]._M_t.
                                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0) != 0);
  }
  else {
LAB_00279f3d:
    uVar26 = 0;
  }
  if (hack_nochem != 0) {
    amrex::MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,0x17,0);
    amrex::MultiFab::Saxpy(mf_new,local_c58,(MultiFab *)local_c60,0,first_spec,0x16,0);
    _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)_Var3.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)_Var3.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)_Var3.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)_Var3.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    goto LAB_0027b66f;
  }
  amrex::BoxArray::BoxArray(&cf_grids);
  if ((char)uVar26 != '\0') {
    _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start
         [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    puVar30 = (undefined8 *)
              ((long)_Var4.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8);
    pBVar31 = &cf_grids;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      *(undefined8 *)&pBVar31->m_bat = *puVar30;
      puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
      pBVar31 = (BoxArray *)((long)pBVar31 + (ulong)bVar40 * -0x10 + 8);
    }
    cf_grids.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          ((long)_Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                 super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&cf_grids.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)_Var4.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x128));
    cf_grids.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = *(element_type **)
            ((long)_Var4.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x130);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&cf_grids.m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)_Var4.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x138));
    amrex::BoxArray::coarsen(&cf_grids,&(this->super_NavierStokesBase).super_AmrLevel.fine_ratio);
  }
  tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
        &(this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  iVar27 = (mf_old->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  iVar11 = (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  iVar22 = *(int *)((long)tVar5.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0);
  if (iVar27 < *(int *)((long)tVar5.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))
  {
    iVar22 = iVar27;
  }
  if (iVar11 < iVar22) {
    iVar22 = iVar11;
  }
  amrex::BoxArray::BoxArray
            (&ba,&(mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  local_c78.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c78.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_c78.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c78.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c78.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c78.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_c78.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  lVar18 = (long)*(int *)(amrex::ParallelContext::frames + 0x10) *
           (long)(anonymous_namespace)::chem_box_chop_threshold;
  local_c00 = uVar26;
  local_be0 = &mf_new->super_FabArray<amrex::FArrayBox>;
  local_bd8._M_head_impl =
       (MultiFab *)
       tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  if (((long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_abox
             ).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_abox
             ).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 < lVar18) {
    iVar27 = 1;
    peVar32 = ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      iVar11 = (this->super_NavierStokesBase).super_AmrLevel.level;
      pIVar6 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).super_AmrMesh
               .super_AmrInfo.max_grid_size.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = pIVar6[iVar11].vect[0] / iVar27;
      iVar29 = pIVar6[iVar11].vect[1] / iVar27;
      iVar11 = pIVar6[iVar11].vect[2] / iVar27;
      if (((iVar17 < 0x10) || (iVar29 < 0x10)) || (iVar11 < 0x10)) break;
      Smfi.fabArray._0_4_ = iVar11;
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = iVar17;
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = iVar29;
      if (((long)(peVar32->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(peVar32->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 < lVar18) {
        lVar24 = 2;
        bVar39 = false;
        do {
          Smfi.tile_size.vect[lVar24 + -4] = Smfi.tile_size.vect[lVar24 + -4] / 2;
          amrex::BoxArray::maxSize(&ba,(IntVect *)&Smfi);
          lVar12 = ((long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
          bVar39 = (bool)(bVar39 | lVar18 <= lVar12);
          bVar38 = lVar24 == 0;
          lVar24 = lVar24 + -1;
          peVar32 = ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (bVar38) break;
        } while (lVar12 < lVar18);
      }
      else {
        bVar39 = false;
      }
      iVar27 = iVar27 * 2;
    } while (!bVar39);
  }
  getFuncCountDM((PeleLM *)&Smfi,(BoxArray *)this,(int)&ba);
  this_02._M_pi =
       local_c78.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_c78.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           CONCAT44(Smfi.m_fa._M_t.
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                    (int)Smfi.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  bVar39 = local_c78.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c78.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var9;
  if (bVar39) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray));
    }
  }
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  FTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            (&STemp,&ba,&local_c78,0x18,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&FTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            (&FTemp,&ba,&local_c78,
             (((FabArray<amrex::FArrayBox> *)&local_c60->super_FabArrayBase)->super_FabArrayBase).
             n_comp,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&fcnCntTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  iVar27 = first_spec;
  pPVar13 = amrex::Periodicity::NonPeriodic();
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.fabArray._0_4_ = 0;
  fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x0;
  fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&STemp.super_FabArray<amrex::FArrayBox>,&mf_old->super_FabArray<amrex::FArrayBox>,
             iVar27,0,0x18,(IntVect *)&Smfi,(IntVect *)&fcnCntTemp,pPVar13,COPY,(CPC *)0x0,false);
  pPVar13 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            (&FTemp.super_FabArray<amrex::FArrayBox>,local_c60,pPVar13,COPY);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  diagTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            (&fcnCntTemp,&ba,&local_c78,1,0,(MFInfo *)&Smfi,
             (FabFactory<amrex::FArrayBox> *)&diagTemp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  amrex::MultiFab::MultiFab(&diagTemp);
  amrex::FabArray<amrex::BaseFab<int>_>::FabArray(&react_mask);
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  Smfi.fabArray._0_4_ = 0;
  Smfi.fabArray._4_4_ = 0;
  Smfi.tile_size.vect[0] = 0;
  Smfi.tile_size.vect[1] = 0;
  Smfi.tile_size.vect[2] = 0;
  Smfi.flags = '\0';
  Smfi._29_3_ = 0;
  Smfi.currentIndex = 0;
  Smfi.beginIndex = 0;
  local_bc0.p = (double *)&PTR__FabFactory_0080bc30;
  local_cb8._0_8_ = (pointer)0x0;
  local_cb8._8_4_ = 0;
  (*react_mask.super_FabArrayBase._vptr_FabArrayBase[3])
            (&react_mask,&ba,&local_c78,1,local_cb8,&Smfi,&local_bc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Smfi.tile_size);
  pPVar13 = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::BaseFab<int>_>::ParallelCopy
            (&react_mask,&(this->super_NavierStokesBase).ebmask,pPVar13,COPY);
  if (plot_reactions == true) {
    pcVar25 = local_cb8 + 0x10;
    local_cb8._0_8_ = pcVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"REACTIONS","");
    this_01 = &this->auxDiag;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)local_cb8);
    amrex::intersect((BoxArray *)&Smfi,&ba,
                     &(((pmVar14->_M_t).
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
    pBVar7 = ((Smfi.tile_array)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar8 = ((Smfi.tile_array)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
    amrex::BoxArray::~BoxArray((BoxArray *)&Smfi);
    if ((pointer)local_cb8._0_8_ != pcVar25) {
      operator_delete((void *)local_cb8._0_8_,local_cb8._16_8_ + 1);
    }
    if (pBVar8 == pBVar7) goto LAB_0027a739;
    local_cb8._0_8_ = pcVar25;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cb8,"REACTIONS","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)local_cb8);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    local_bc0.p = (double *)&PTR__FabFactory_0080b918;
    amrex::MultiFab::define
              (&diagTemp,&ba,&local_c78,
               (((pmVar14->_M_t).
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
               super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,(MFInfo *)&Smfi,
               (FabFactory<amrex::FArrayBox> *)&local_bc0);
    pIVar1 = &Smfi.tile_size;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pIVar1);
    if ((pointer)local_cb8._0_8_ != pcVar25) {
      operator_delete((void *)local_cb8._0_8_,local_cb8._16_8_ + 1);
    }
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )pIVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&Smfi,"REACTIONS","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](this_01,(key_type *)&Smfi);
    pFVar37 = &((pmVar14->_M_t).
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
               super_FabArray<amrex::FArrayBox>;
    pPVar13 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (&diagTemp.super_FabArray<amrex::FArrayBox>,pFVar37,pPVar13,COPY);
    if (Smfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
        pIVar1) {
      operator_delete((void *)Smfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                      Smfi.tile_size.vect._0_8_ + 1);
    }
    uVar26 = (undefined4)CONCAT71((int7)((ulong)pcVar25 >> 8),1);
  }
  else {
LAB_0027a739:
    uVar26 = 0;
  }
  if (2 < NavierStokesBase::verbose) {
    poVar16 = amrex::OutStream();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
         *(undefined4 *)(DAT_00816950 + -0x30);
    pIVar1 = &Smfi.tile_size;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
         *(undefined4 *)(DAT_00816950 + -0x48);
    Smfi.fabArray._0_4_ = (int)poVar16;
    Smfi.fabArray._4_4_ = (undefined4)((ulong)poVar16 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
    *(undefined8 *)((long)Smfi.tile_size.vect + *(long *)(Smfi.tile_size.vect._0_8_ + -0x18) + 8) =
         *(undefined8 *)
          ((long)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) +
          *(long *)(*(long *)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pIVar1,"      PeleLM::advance_chemistry() FABs in tmp MF: ",0x32);
    std::ostream::operator<<
              (pIVar1,(int)((ulong)((long)((STemp.super_FabArray<amrex::FArrayBox>.
                                            super_FabArrayBase.boxarray.m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)((STemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                                           .boxarray.m_ref.
                                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x49249249);
    local_cb8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,local_cb8,1);
    amrex::Print::~Print((Print *)&Smfi);
  }
  amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)&STemp,true);
  local_c04 = uVar26;
  if (Smfi.currentIndex < Smfi.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_bfc,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_cb8,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_bc0,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,0x15);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_940,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,0x16);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_980,&fcnCntTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_b48,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_900,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi,0x15);
      amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                (&local_7f0,&react_mask,&Smfi);
      local_c10 = CONCAT44(local_c10._4_4_,local_bfc.bigend.vect[2]);
      if (local_bfc.smallend.vect[2] <= local_bfc.bigend.vect[2]) {
        local_c28 = (undefined **)local_bc0.p;
        local_c30 = local_bc0.kstride;
        local_c48 = (long)local_bfc.smallend.vect[1];
        lVar18 = (long)local_bfc.smallend.vect[0];
        local_c40 = (double)((local_c48 - local_b48.begin.y) *
                             CONCAT44(local_b48.jstride._4_4_,(int)local_b48.jstride) * 8 +
                             lVar18 * 8 + (long)local_b48.begin.x * -8 +
                            CONCAT44(local_b48.p._4_4_,(int)local_b48.p));
        local_c38 = CONCAT44(local_b48.kstride._4_4_,(int)local_b48.kstride) * 8;
        local_b58 = -(long)local_b48.begin.z;
        local_b50 = (pointer)(local_cb8._0_8_ +
                             (local_c48 - local_c94) *
                             CONCAT44(local_cb8._12_4_,local_cb8._8_4_) * 8 + lVar18 * 8 +
                             (long)local_c98 * -8);
        local_c50 = local_cb8._16_8_ * 8;
        local_c20 = -(long)local_c90;
        local_b60 = (long)local_bc0.begin.z;
        local_b68 = local_900.p;
        local_b70.super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
             (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)
             (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)local_900.kstride;
        local_b78 = (long)local_900.begin.z;
        local_c18 = (ulong)(uint)local_bfc.bigend.vect[1];
        iVar27 = local_bfc.smallend.vect[2];
        do {
          if (local_bfc.smallend.vect[1] <= local_bfc.bigend.vect[1]) {
            lVar24 = (long)iVar27;
            local_d38 = (double *)((local_b58 + lVar24) * local_c38 + (long)local_c40);
            pdVar34 = (double *)(local_b50 + (local_c20 + lVar24) * local_c50);
            lVar23 = (lVar24 - local_b60) * local_bc0.kstride;
            lVar12 = (lVar24 - local_b78) * local_900.kstride;
            lVar24 = local_c48;
            do {
              if (local_bfc.smallend.vect[0] <= local_bfc.bigend.vect[0]) {
                lVar19 = (lVar24 - local_bc0.begin.y) * local_bc0.jstride;
                lVar20 = (lVar24 - local_900.begin.y) * local_900.jstride;
                pdVar15 = local_d38;
                lVar36 = lVar18;
                pdVar33 = pdVar34;
                do {
                  lVar28 = 0x15;
                  pdVar21 = pdVar15;
                  pdVar35 = pdVar33;
                  do {
                    *pdVar35 = *pdVar35 * 0.001;
                    *pdVar21 = *pdVar21 * 0.001;
                    pdVar21 = pdVar21 + local_b48.nstride;
                    pdVar35 = pdVar35 + local_cb8._24_8_;
                    lVar28 = lVar28 + -1;
                  } while (lVar28 != 0);
                  local_bc0.p[lVar23 + lVar19 + (lVar36 - local_bc0.begin.x)] =
                       (double)((double)local_bc0.p[lVar23 + lVar19 + (lVar36 - local_bc0.begin.x)]
                               * 10.0);
                  local_900.p[lVar12 + lVar20 + (lVar36 - local_900.begin.x)] =
                       local_900.p[lVar12 + lVar20 + (lVar36 - local_900.begin.x)] * 10.0;
                  lVar36 = lVar36 + 1;
                  pdVar15 = pdVar15 + 1;
                  pdVar33 = pdVar33 + 1;
                } while (local_bfc.bigend.vect[0] + 1 != (int)lVar36);
              }
              lVar24 = lVar24 + 1;
              local_d38 = local_d38 + CONCAT44(local_b48.jstride._4_4_,(int)local_b48.jstride);
              pdVar34 = pdVar34 + CONCAT44(local_cb8._12_4_,local_cb8._8_4_);
            } while (local_bfc.bigend.vect[1] + 1U != (int)lVar24);
          }
          bVar39 = iVar27 != local_bfc.bigend.vect[2];
          iVar27 = iVar27 + 1;
        } while (bVar39);
      }
      dt_incr = local_c58;
      time_chem = 0.0;
      (**(code **)(*(long *)m_reactor._M_t.
                            super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>.
                            _M_head_impl + 0x28))
                (m_reactor._M_t.
                 super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl
                 ,&local_bfc,local_cb8,&local_b48,&local_940,&local_bc0,&local_900,&local_980,
                 &local_7f0,&dt_incr,&time_chem);
      dt_incr = local_c58;
      time_chem = 0.0;
      if (local_bfc.smallend.vect[2] <= local_bfc.bigend.vect[2]) {
        iVar27 = local_bfc.smallend.vect[2];
        do {
          if (local_bfc.smallend.vect[1] <= local_bfc.bigend.vect[1]) {
            pdVar34 = (double *)
                      (local_cb8._0_8_ +
                      ((long)iVar27 - (long)local_c90) * local_cb8._16_8_ * 8 +
                      ((long)local_bfc.smallend.vect[1] - (long)local_c94) *
                      CONCAT44(local_cb8._12_4_,local_cb8._8_4_) * 8 +
                      (long)local_bfc.smallend.vect[0] * 8 + (long)local_c98 * -8);
            lVar24 = ((long)iVar27 - (long)local_bc0.begin.z) * local_bc0.kstride;
            lVar18 = (long)local_bfc.smallend.vect[1];
            do {
              if (local_bfc.smallend.vect[0] <= local_bfc.bigend.vect[0]) {
                lVar23 = (lVar18 - local_bc0.begin.y) * local_bc0.jstride;
                pdVar15 = pdVar34;
                lVar12 = (long)local_bfc.smallend.vect[0];
                do {
                  lVar36 = 0x15;
                  pdVar33 = pdVar15;
                  do {
                    *pdVar33 = *pdVar33 * 1000.0;
                    pdVar33 = pdVar33 + local_cb8._24_8_;
                    lVar36 = lVar36 + -1;
                  } while (lVar36 != 0);
                  local_bc0.p[lVar24 + lVar23 + (lVar12 - local_bc0.begin.x)] =
                       (double)((double)local_bc0.p[lVar24 + lVar23 + (lVar12 - local_bc0.begin.x)]
                               * 0.1);
                  lVar12 = lVar12 + 1;
                  pdVar15 = pdVar15 + 1;
                } while (local_bfc.bigend.vect[0] + 1 != (int)lVar12);
              }
              lVar18 = lVar18 + 1;
              pdVar34 = pdVar34 + CONCAT44(local_cb8._12_4_,local_cb8._8_4_);
            } while (local_bfc.bigend.vect[1] + 1U != (int)lVar18);
          }
          bVar39 = iVar27 != local_bfc.bigend.vect[2];
          iVar27 = iVar27 + 1;
        } while (bVar39);
      }
      amrex::MFIter::operator++(&Smfi);
    } while (Smfi.currentIndex < Smfi.endIndex);
  }
  amrex::MFIter::~MFIter(&Smfi);
  amrex::FabArray<amrex::FArrayBox>::clear(&FTemp.super_FabArray<amrex::FArrayBox>);
  this_03._M_head_impl = (MultiFab *)local_bd8;
  pFVar37 = local_be0;
  iVar27 = first_spec;
  pPVar13 = amrex::Periodicity::NonPeriodic();
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.fabArray._0_4_ = 0;
  local_cb8._0_8_ = (pointer)0x0;
  local_cb8._8_4_ = 0;
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (pFVar37,&STemp.super_FabArray<amrex::FArrayBox>,0,iVar27,0x18,(IntVect *)&Smfi,
             (IntVect *)local_cb8,pPVar13,COPY,(CPC *)0x0,false);
  amrex::FabArray<amrex::FArrayBox>::clear(&STemp.super_FabArray<amrex::FArrayBox>);
  amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)mf_old,true);
  if (Smfi.currentIndex < Smfi.endIndex) {
    local_c40 = 1.0 / local_c58;
    do {
      amrex::MFIter::tilebox((Box *)&local_b48,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_cb8,&mf_old->super_FabArray<amrex::FArrayBox>,&Smfi,
                 first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_bc0,pFVar37,&Smfi,first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_940,local_c60,&Smfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_980,&(this_03._M_head_impl)->super_FabArray<amrex::FArrayBox>,&Smfi);
      lVar12 = (long)local_b48.p._4_4_;
      lVar24 = (long)(int)local_b48.p;
      lVar18 = CONCAT44(local_cb8._12_4_,local_cb8._8_4_) * 8;
      local_d28 = (lVar12 - local_980.begin.y) * local_980.jstride * 8 + lVar24 * 8 +
                  (long)local_980.begin.x * -8 + (long)local_980.p;
      local_c20 = local_980.nstride * 8;
      local_d00 = (lVar12 - local_940.begin.y) * local_940.jstride * 8 + lVar24 * 8 +
                  (long)local_940.begin.x * -8 + (long)local_940.p;
      local_c28 = (undefined **)(local_940.nstride * 8);
      local_d08 = (lVar12 - local_bc0.begin.y) * local_bc0.jstride * 8 + lVar24 * 8 +
                  (long)local_bc0.begin.x * -8 + (long)local_bc0.p;
      local_c30 = local_bc0.nstride * 8;
      local_d10 = (pointer)(local_cb8._0_8_ +
                           (lVar12 - local_c94) * lVar18 + lVar24 * 8 + (long)local_c98 * -8);
      local_c38 = local_cb8._24_8_ * 8;
      local_c48 = local_cb8._16_8_ * 8;
      local_c10 = -(long)local_c90;
      local_c50 = CONCAT44(local_c50._4_4_,(int)local_b48.jstride);
      uVar10 = 0;
      do {
        local_c18 = uVar10;
        iVar27 = (int)local_b48.jstride;
        if ((int)local_b48.jstride <= local_b48.kstride._4_4_) {
          do {
            if (local_b48.p._4_4_ <= (int)local_b48.kstride) {
              lVar24 = (long)iVar27;
              lVar19 = (lVar24 - local_980.begin.z) * local_980.kstride * 8 + local_d28;
              lVar23 = (lVar24 - local_940.begin.z) * local_940.kstride * 8 + local_d00;
              lVar36 = (lVar24 - local_bc0.begin.z) * local_bc0.kstride * 8 + local_d08;
              pcVar25 = local_d10 + (lVar24 + local_c10) * local_c48;
              lVar24 = lVar12;
              do {
                if ((int)local_b48.p <= local_b48.jstride._4_4_) {
                  lVar20 = 0;
                  do {
                    *(double *)(lVar19 + lVar20 * 8) =
                         -(*(double *)(pcVar25 + lVar20 * 8) - *(double *)(lVar36 + lVar20 * 8)) *
                         local_c40 - *(double *)(lVar23 + lVar20 * 8);
                    lVar20 = lVar20 + 1;
                  } while ((local_b48.jstride._4_4_ - (int)local_b48.p) + 1 != (int)lVar20);
                }
                lVar24 = lVar24 + 1;
                lVar19 = lVar19 + local_980.jstride * 8;
                lVar23 = lVar23 + local_940.jstride * 8;
                lVar36 = lVar36 + local_bc0.jstride * 8;
                pcVar25 = pcVar25 + lVar18;
              } while ((int)local_b48.kstride + 1 != (int)lVar24);
            }
            bVar39 = iVar27 != local_b48.kstride._4_4_;
            iVar27 = iVar27 + 1;
          } while (bVar39);
        }
        local_d28 = local_d28 + local_c20;
        local_d00 = local_d00 + (long)local_c28;
        local_d08 = local_d08 + local_c30;
        local_d10 = local_d10 + local_c38;
        uVar10 = local_c18 + 1;
      } while (local_c18 + 1 != 0x15);
      amrex::MFIter::operator++(&Smfi);
      this_03._M_head_impl = (MultiFab *)local_bd8;
      pFVar37 = local_be0;
    } while (Smfi.currentIndex < Smfi.endIndex);
  }
  amrex::MFIter::~MFIter(&Smfi);
  if ((char)local_c04 != '\0') {
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )&Smfi.tile_size;
    std::__cxx11::string::_M_construct<char_const*>((string *)&Smfi,"REACTIONS","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
              ::operator[](&this->auxDiag,(key_type *)&Smfi);
    pFVar37 = &((pmVar14->_M_t).
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
               super_FabArray<amrex::FArrayBox>;
    pPVar13 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (pFVar37,&diagTemp.super_FabArray<amrex::FArrayBox>,pPVar13,COPY);
    if (Smfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
        &Smfi.tile_size) {
      operator_delete((void *)Smfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                      Smfi.tile_size.vect._0_8_ + 1);
    }
    amrex::FabArray<amrex::FArrayBox>::clear(&diagTemp.super_FabArray<amrex::FArrayBox>);
  }
  _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->super_NavierStokesBase).super_AmrLevel.state.
       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
       super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  iVar27 = ((IntVect *)
           ((long)_Var3.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0];
  if (iVar22 <= iVar27) {
    iVar27 = iVar22;
  }
  pPVar13 = amrex::Periodicity::NonPeriodic();
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
  Smfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  Smfi.fabArray._0_4_ = 0;
  local_cb8._4_4_ = iVar27;
  local_cb8._0_4_ = iVar27;
  local_cb8._8_4_ = iVar27;
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            ((FabArray<amrex::FArrayBox> *)
             _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             &fcnCntTemp.super_FabArray<amrex::FArrayBox>,0,0,1,(IntVect *)&Smfi,
             (IntVect *)local_cb8,pPVar13,COPY,(CPC *)0x0,false);
  amrex::FabArray<amrex::FArrayBox>::clear(&fcnCntTemp.super_FabArray<amrex::FArrayBox>);
  if ((char)local_c00 != '\0') {
    NavierStokesBase::average_down
              (&this->super_NavierStokesBase,
               *(MultiFab **)
                (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level)
                                 .
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1].
                                 _M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0),this_03._M_head_impl,0,0x15);
  }
  if (0 < iVar22) {
    this_00 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    PVar42 = amrex::Geometry::periodicity(this_00);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = PVar42.period.vect[0];
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = PVar42.period.vect[1];
    Smfi.fabArray._0_4_ = PVar42.period.vect[2];
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&(this_03._M_head_impl)->super_FabArray<amrex::FArrayBox>,0,0x15,(Periodicity *)&Smfi
               ,false);
    amrex::Extrapolater::FirstOrderExtrap
              (this_03._M_head_impl,this_00,0,0x15,
               ((this_03._M_head_impl)->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.
               vect[0]);
  }
  amrex::FabArray<amrex::BaseFab<int>_>::~FabArray(&react_mask);
  amrex::MultiFab::~MultiFab(&diagTemp);
  amrex::MultiFab::~MultiFab(&fcnCntTemp);
  amrex::MultiFab::~MultiFab(&FTemp);
  amrex::MultiFab::~MultiFab(&STemp);
  if (local_c78.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c78.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  amrex::BoxArray::~BoxArray(&ba);
  amrex::BoxArray::~BoxArray(&cf_grids);
LAB_0027b66f:
  if (2 < NavierStokesBase::verbose) {
    dVar41 = amrex::ParallelDescriptor::second();
    poVar16 = amrex::OutStream();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
         *(undefined4 *)(DAT_00816950 + -0x30);
    pIVar1 = &Smfi.tile_size;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
         *(undefined4 *)(DAT_00816950 + -0x48);
    Smfi.fabArray._0_4_ = (int)poVar16;
    Smfi.fabArray._4_4_ = (undefined4)((ulong)poVar16 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
    *(undefined8 *)((long)Smfi.tile_size.vect + *(long *)(Smfi.tile_size.vect._0_8_ + -0x18) + 8) =
         *(undefined8 *)
          ((long)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) +
          *(long *)(*(long *)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pIVar1,"      PeleLM::advance_chemistry(): lev: ",0x28);
    std::ostream::operator<<(pIVar1,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,", time: [",9);
    dVar41 = dVar41 - local_b80;
    std::ostream::_M_insert<double>(dVar41);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1," ... ",5);
    std::ostream::_M_insert<double>(dVar41);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,"]\n",2);
    amrex::Print::~Print((Print *)&Smfi);
  }
  return;
}

Assistant:

void
PeleLM::advance_chemistry (MultiFab&       mf_old,
                           MultiFab&       mf_new,
                           Real            dt,
                           const MultiFab& Force)
{
  BL_PROFILE("PLM::advance_chemistry()");

  const Real strt_time = ParallelDescriptor::second();

  const bool do_avg_down_chem = avg_down_chem
    && level < parent->finestLevel()
    && getLevel(level+1).state[RhoYdot_Type].hasOldData();

  if (hack_nochem)
  {
    MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,NUM_SPECIES+2,0);
    MultiFab::Saxpy(mf_new,dt,Force,0,first_spec,NUM_SPECIES+1,0);
    get_new_data(RhoYdot_Type).setVal(0);
    get_new_data(FuncCount_Type).setVal(0);
  }
  else
  {
    BoxArray cf_grids;

    if (do_avg_down_chem)
    {
      cf_grids = getLevel(level+1).boxArray(); cf_grids.coarsen(fine_ratio);
    }

    MultiFab&  React_new = get_new_data(RhoYdot_Type);
    const int  ngrow     = std::min(std::min(React_new.nGrow(),mf_old.nGrow()),mf_new.nGrow());

    BoxArray  ba           = mf_new.boxArray();
    DistributionMapping dm = mf_new.DistributionMap();
#ifndef AMREX_USE_GPU
    //
    // Chop the grids to level out the chemistry work when on the CPU.
    // We want enough grids so that KNAPSACK works well,
    // but not too many to make unweildy BoxArrays.
    //
    const int Threshold = chem_box_chop_threshold * ParallelDescriptor::NProcs();
    bool      done      = (ba.size() >= Threshold);

    for (int cnt = 1; !done; cnt *= 2)
    {
      const IntVect ChunkSize = parent->maxGridSize(level)/cnt;

      if ( AMREX_D_TERM(ChunkSize[0] < 16, || ChunkSize[1] < 16, || ChunkSize[2] < 16) )
        //
        // Don't let grids get too small.
        //
        break;

      IntVect chunk(ChunkSize);

      for (int j = AMREX_SPACEDIM-1; j >=0 && ba.size() < Threshold; j--)
      {
        chunk[j] /= 2;
        ba.maxSize(chunk);
        if (ba.size() >= Threshold) done = true;
      }
    }

    dm = getFuncCountDM(ba,ngrow);
#endif

    MultiFab STemp(ba, dm, NUM_SPECIES+3, 0);
    MultiFab FTemp(ba, dm, Force.nComp(), 0);

    STemp.ParallelCopy(mf_old,first_spec,0,NUM_SPECIES+3); // Parallel copy.
    FTemp.ParallelCopy(Force);                          // Parallel copy.

    MultiFab fcnCntTemp(ba, dm, 1, 0);
    MultiFab diagTemp;

    // Setup a mask for chemistry. Right used only for EB.
    // TODO: find a way to set that up properly when running boxes on GPU.
    amrex::FabArray<amrex::BaseFab<int>>  react_mask;
    react_mask.define(ba, dm,  1, 0);
#ifdef AMREX_USE_EB
    react_mask.ParallelCopy(ebmask);
#else
    react_mask.setVal(1);
#endif

    const bool do_diag = plot_reactions && amrex::intersect(ba,auxDiag["REACTIONS"]->boxArray()).size() != 0;

    if (do_diag)
    {
        diagTemp.define(ba, dm, auxDiag["REACTIONS"]->nComp(), 0);
        diagTemp.ParallelCopy(*auxDiag["REACTIONS"]); // Parallel copy
    }

    if (verbose > 2)
      amrex::Print() << "      PeleLM::advance_chemistry() FABs in tmp MF: " << STemp.size() << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter Smfi(STemp,amrex::TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
    {
        const Box& bx       = Smfi.tilebox();
        auto const& rhoY     = STemp.array(Smfi);
        auto const& rhoH     = STemp.array(Smfi,NUM_SPECIES);
        auto const& temp     = STemp.array(Smfi,NUM_SPECIES+1);
        auto const& fcl      = fcnCntTemp.array(Smfi);
        auto const& frc_rhoY = FTemp.array(Smfi);
        auto const& frc_rhoH = FTemp.array(Smfi, NUM_SPECIES);
        auto const& mask     = react_mask.array(Smfi);

        // Convert MKS -> CGS
        ParallelFor(bx, [rhoY,rhoH, frc_rhoY, frc_rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e-3;
              frc_rhoY(i,j,k,n) *= 1.0e-3;
           }
           rhoH(i,j,k) *= 10.0;
           frc_rhoH(i,j,k) *= 10.0;
        });

        BL_PROFILE_VAR("React()", ReactInLoop);
        Real dt_incr     = dt;
        Real time_chem   = 0;
        /* Solve */
        m_reactor->react(bx, rhoY, frc_rhoY, temp,
                         rhoH, frc_rhoH, fcl,
                         mask, dt_incr, time_chem
#ifdef AMREX_USE_GPU
                         , amrex::Gpu::gpuStream()
#endif
                         );
        dt_incr   = dt;
        time_chem = 0;
        BL_PROFILE_VAR_STOP(ReactInLoop);

        // Convert CGS -> MKS
        ParallelFor(bx, [rhoY,rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e3;
           }
           rhoH(i,j,k) *= 0.1;
        });

#ifdef AMREX_USE_GPU
        Gpu::Device::streamSynchronize();
#endif
    }

    FTemp.clear();

    mf_new.ParallelCopy(STemp,0,first_spec,NUM_SPECIES+3); // Parallel copy.

    STemp.clear();

    //
    // Set React_new (I_R).
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_old,amrex::TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx         = mfi.tilebox();
        auto const& rhoY_o    = mf_old.const_array(mfi,first_spec);
        auto const& rhoY_n    = mf_new.const_array(mfi,first_spec);
        auto const& frc_rhoY  = Force.const_array(mfi);
        auto const& rhoYdot   = React_new.array(mfi);
        Real dt_inv = 1.0/dt;
        ParallelFor(bx, NUM_SPECIES, [rhoY_o, rhoY_n, frc_rhoY, rhoYdot, dt_inv]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           rhoYdot(i,j,k,n) = - ( rhoY_o(i,j,k,n) - rhoY_n(i,j,k,n) ) * dt_inv - frc_rhoY(i,j,k,n);
        });
    }

    if (do_diag)
    {
      auxDiag["REACTIONS"]->ParallelCopy(diagTemp); // Parallel copy
      diagTemp.clear();
    }

    MultiFab& FC = get_new_data(FuncCount_Type);
    FC.ParallelCopy(fcnCntTemp,0,0,1,0,std::min(ngrow,FC.nGrow()));
    fcnCntTemp.clear();
    //
    // Approximate covered crse chemistry (I_R) with averaged down fine I_R from previous time step.
    //
    if (do_avg_down_chem)
    {
      MultiFab& fine_React = getLevel(level+1).get_old_data(RhoYdot_Type);
      average_down(fine_React, React_new, 0, NUM_SPECIES);
    }
    //
    // Ensure consistent grow cells.
    //
    if (ngrow > 0)
    {
      React_new.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React_new, geom, 0, NUM_SPECIES, React_new.nGrow());
    }
  }

  if (verbose > 2)
  {
    const int IOProc = ParallelDescriptor::IOProcessorNumber();

    Real mx = ParallelDescriptor::second() - strt_time, mn = mx;

    ParallelDescriptor::ReduceRealMin(mn,IOProc);
    ParallelDescriptor::ReduceRealMax(mx,IOProc);

    amrex::Print() << "      PeleLM::advance_chemistry(): lev: " << level << ", time: ["
                   << mn << " ... " << mx << "]\n";
  }
}